

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_timer.cpp
# Opt level: O0

double __thiscall crnlib::timer::get_elapsed_secs(timer *this)

{
  long lVar1;
  undefined1 auVar2 [16];
  timer_ticks delta;
  timer_ticks stop_time;
  timer *this_local;
  
  if ((this->field_0x10 & 1) == 0) {
    this_local = (timer *)0x0;
  }
  else {
    delta = this->m_stop_time;
    if (((byte)this->field_0x10 >> 1 & 1) == 0) {
      stop_time = (timer_ticks)this;
      query_counter(&delta);
    }
    lVar1 = delta - this->m_start_time;
    auVar2._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar2._0_8_ = lVar1;
    auVar2._12_4_ = 0x45300000;
    this_local = (timer *)(((auVar2._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) *
                          g_inv_freq);
  }
  return (double)this_local;
}

Assistant:

double timer::get_elapsed_secs() const
    {
        CRNLIB_ASSERT(m_started);
        if (!m_started)
        {
            return 0;
        }

        timer_ticks stop_time = m_stop_time;
        if (!m_stopped)
        {
            query_counter(&stop_time);
        }

        timer_ticks delta = stop_time - m_start_time;
        return delta * g_inv_freq;
    }